

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase132::run(TestCase132 *this)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  EnumSchema schema;
  Fault f;
  uint local_6f0;
  uint local_6ec;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_1;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  Enumerant enumerant;
  Enumerant lookup;
  
  schema.super_Schema.raw = (Schema)((long)schemas::s_9c8e9318b29d9cd3 + 0x48);
  Schema::getProto((Reader *)&_kjCondition_1,&schema.super_Schema);
  if ((uint)_kjCondition_1.left.ptr.field_1._24_4_ < 0x40) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right =
         *(unsigned_long *)_kjCondition_1.left.ptr.field_1.value.ownFile.content.size_;
  }
  _kjCondition.left = 0x9c8e9318b29d9cd3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x9c8e9318b29d9cd3;
  if ((_kjCondition.right != 0x9c8e9318b29d9cd3) && (kj::_::Debug::minSeverity < 3)) {
    enumerant.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x9c8e9318b29d9cd3;
    Schema::getProto((Reader *)&_kjCondition_1,&schema.super_Schema);
    if ((uint)_kjCondition_1.left.ptr.field_1._24_4_ < 0x40) {
      lookup.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    }
    else {
      lookup.parent.super_Schema.raw =
           *(Schema *)_kjCondition_1.left.ptr.field_1.value.ownFile.content.size_;
    }
    kj::_::Debug::
    log<char_const(&)[69],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"(typeId<TestEnum>()) == (schema.getProto().getId())\", _kjCondition, typeId<TestEnum>(), schema.getProto().getId()"
               ,(char (*) [69])
                "failed: expected (typeId<TestEnum>()) == (schema.getProto().getId())",&_kjCondition
               ,(unsigned_long *)&enumerant,(unsigned_long *)&lookup);
  }
  Schema::getDependency(&schema.super_Schema,0xa0a8f314b80b63fd);
  enumerant.parent.super_Schema.raw =
       (Schema)((ulong)enumerant.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&enumerant);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_1,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&enumerant);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[112],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x89,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestAllTypes>()); }) != kj::none\", _kjCondition"
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestAllTypes>()); }) != kj::none"
               ,&_kjCondition_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  Schema::getDependency(&schema.super_Schema,0x9c8e9318b29d9cd3);
  enumerant.parent.super_Schema.raw =
       (Schema)((ulong)enumerant.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&enumerant);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_1,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&enumerant);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[108],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x8a,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestEnum>()); }) != kj::none\", _kjCondition"
               ,(char (*) [108])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestEnum>()); }) != kj::none"
               ,&_kjCondition_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  Schema::asStruct(&schema.super_Schema);
  enumerant.parent.super_Schema.raw =
       (Schema)((ulong)enumerant.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&enumerant);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_1,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&enumerant);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x8c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asStruct(); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asStruct(); }) != kj::none"
               ,&_kjCondition_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  Schema::asInterface(&schema.super_Schema);
  enumerant.parent.super_Schema.raw =
       (Schema)((ulong)enumerant.parent.super_Schema.raw & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&enumerant);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_1,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&enumerant);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x8d,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none\", _kjCondition"
               ,(char (*) [88])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none"
               ,&_kjCondition_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  _kjCondition_1.left.ptr._0_8_ = Schema::asEnum(&schema.super_Schema);
  _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)&DAT_00000005;
  _kjCondition_1.left.ptr.field_1._24_1_ =
       (Schema)_kjCondition_1.left.ptr._0_8_ == schema.super_Schema.raw;
  _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)&schema.super_Schema;
  if (((Schema)_kjCondition_1.left.ptr._0_8_ != schema.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"schema.asEnum() == schema\", _kjCondition",
               (char (*) [43])"failed: expected schema.asEnum() == schema",
               (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)&_kjCondition_1);
  }
  EnumSchema::getEnumerants((EnumerantList *)&_kjCondition_1,(EnumSchema *)&schema.super_Schema);
  uVar1 = _kjCondition_1.left.ptr.field_1._24_4_;
  Schema::getProto((Reader *)&lookup,&schema.super_Schema);
  auVar2 = (undefined1  [16])lookup._0_16_;
  enumerant.proto._reader.data = lookup.proto._reader.data;
  enumerant.proto._reader.pointers = lookup.proto._reader.pointers;
  enumerant.proto._reader.segment = lookup.proto._reader.segment;
  enumerant.proto._reader.capTable = lookup.proto._reader.capTable;
  enumerant.parent = lookup.parent;
  enumerant.ordinal = lookup.ordinal;
  enumerant._10_6_ = lookup._10_6_;
  lookup._0_16_ = auVar2;
  capnp::schema::Node::Enum::Reader::getEnumerants((Reader *)&_kjCondition,(Reader *)&enumerant);
  _kjCondition_6.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_6.left = uVar1;
  _kjCondition_6.op.content.ptr = " == ";
  _kjCondition_6.op.content.size_ = 5;
  _kjCondition_6.result = uVar1 == (uint)_kjCondition.op.content.size_;
  if (_kjCondition_6.result) {
    EnumSchema::getEnumerants((EnumerantList *)&_kjCondition_1,&schema);
    EnumSchema::EnumerantList::operator[](&enumerant,(EnumerantList *)&_kjCondition_1,0);
    _kjCondition_6._0_8_ = anon_var_dwarf_3ca9f;
    _kjCondition._32_8_ = enumerant.proto._reader._32_8_;
    uStack_4d0 = enumerant.proto._reader._40_8_;
    _kjCondition.op.content.ptr = (char *)enumerant.proto._reader.data;
    _kjCondition.op.content.size_ = (size_t)enumerant.proto._reader.pointers;
    _kjCondition.left = (unsigned_long)enumerant.proto._reader.segment;
    _kjCondition.right = (unsigned_long)enumerant.proto._reader.capTable;
    lookup._0_16_ = capnp::schema::Enumerant::Reader::getName((Reader *)&_kjCondition);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
               (DebugExpression<char_const(&)[4]> *)&_kjCondition_6,(Reader *)&lookup);
    if (kj::_::Debug::minSeverity < 3 && _kjCondition_1.left.ptr.field_1.value.line._0_1_ == '\0') {
      _kjCondition._32_8_ = enumerant.proto._reader._32_8_;
      uStack_4d0 = enumerant.proto._reader._40_8_;
      _kjCondition.op.content.ptr = (char *)enumerant.proto._reader.data;
      _kjCondition.op.content.size_ = (size_t)enumerant.proto._reader.pointers;
      _kjCondition.left = (unsigned_long)enumerant.proto._reader.segment;
      _kjCondition.right = (unsigned_long)enumerant.proto._reader.capTable;
      lookup._0_16_ = capnp::schema::Enumerant::Reader::getName((Reader *)&_kjCondition);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x93,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (enumerant.getProto().getName())\", _kjCondition, \"foo\", enumerant.getProto().getName()"
                 ,(char (*) [61])"failed: expected (\"foo\") == (enumerant.getProto().getName())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
                 (char (*) [4])"foo",(Reader *)&lookup);
    }
    _kjCondition_1.left.ptr._0_8_ = enumerant.parent.super_Schema.raw;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)&schema;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_3d166;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)&DAT_00000005;
    _kjCondition_1.left.ptr.field_1._24_1_ =
         enumerant.parent.super_Schema.raw == schema.super_Schema.raw;
    if ((enumerant.parent.super_Schema.raw != schema.super_Schema.raw) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"enumerant.getContainingEnum() == schema\", _kjCondition",
                 (char (*) [57])"failed: expected enumerant.getContainingEnum() == schema",
                 (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)&_kjCondition_1);
    }
    name.content.size_ = 4;
    name.content.ptr = "foo";
    EnumSchema::getEnumerantByName(&lookup,&schema,name);
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_3d166;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)&DAT_00000005;
    _kjCondition_1.left.ptr.field_1._24_1_ =
         lookup.ordinal == enumerant.ordinal &&
         lookup.parent.super_Schema.raw == enumerant.parent.super_Schema.raw;
    _kjCondition_1.left.ptr._0_8_ = &lookup;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)&enumerant;
    if ((lookup.ordinal != enumerant.ordinal ||
         lookup.parent.super_Schema.raw != enumerant.parent.super_Schema.raw) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<capnp::EnumSchema::Enumerant&,capnp::EnumSchema::Enumerant&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x97,ERROR,"\"failed: expected \" \"lookup == enumerant\", _kjCondition",
                 (char (*) [37])"failed: expected lookup == enumerant",
                 (DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant_&> *)
                 &_kjCondition_1);
    }
    EnumSchema::getEnumerants((EnumerantList *)&_kjCondition_6,&schema);
    EnumSchema::EnumerantList::operator[]
              ((Enumerant *)&_kjCondition,(EnumerantList *)&_kjCondition_6,1);
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ = _kjCondition.right;
    _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
         (ArrayDisposer *)_kjCondition.op.content.ptr;
    _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.left.ptr.field_1._32_8_ = _kjCondition._32_8_;
    _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)uStack_4d0;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)anon_var_dwarf_43885;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)&DAT_00000005;
    _kjCondition_1.left.ptr.field_1._80_1_ =
         lookup.ordinal != (uint16_t)_kjCondition.right ||
         lookup.parent.super_Schema.raw != (Schema)_kjCondition.left;
    _kjCondition_1.left.ptr._0_8_ = &lookup;
    if ((lookup.ordinal == (uint16_t)_kjCondition.right &&
         lookup.parent.super_Schema.raw == (Schema)_kjCondition.left) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<capnp::EnumSchema::Enumerant&,capnp::EnumSchema::Enumerant>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x98,ERROR,
                 "\"failed: expected \" \"lookup != schema.getEnumerants()[1]\", _kjCondition",
                 (char (*) [53])"failed: expected lookup != schema.getEnumerants()[1]",
                 (DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant> *)
                 &_kjCondition_1);
    }
    name_00.content.size_ = 0x10;
    name_00.content.ptr = "noSuchEnumerant";
    EnumSchema::findEnumerantByName
              ((Maybe<capnp::EnumSchema::Enumerant> *)&_kjCondition,&schema,name_00);
    if ((byte)_kjCondition.left == 1) {
      _kjCondition_1.left.ptr.field_1._32_8_ = uStack_4d0;
      _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)local_4c8;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)_kjCondition.op.content.size_;
      _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition._32_8_;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.right;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ =
           (size_t)_kjCondition.op.content.ptr;
    }
    _kjCondition_1.left.ptr.isSet = (bool)(byte)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.size_._0_1_ =
         (byte)_kjCondition.left ^ 1;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)&kj::none;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)anon_var_dwarf_3d166;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.ptr = &DAT_00000005;
    if (((byte)_kjCondition.left != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x9a,ERROR,
                 "\"failed: expected \" \"schema.findEnumerantByName(\\\"noSuchEnumerant\\\") == kj::none\", _kjCondition"
                 ,(char (*) [75])
                  "failed: expected schema.findEnumerantByName(\"noSuchEnumerant\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
    name_01.content.size_ = 4;
    name_01.content.ptr = "bar";
    EnumSchema::findEnumerantByName
              ((Maybe<capnp::EnumSchema::Enumerant> *)&_kjCondition,&schema,name_01);
    if ((byte)_kjCondition.left == '\x01') {
      _kjCondition_1.left.ptr.field_1._32_8_ = uStack_4d0;
      _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)local_4c8;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)_kjCondition.op.content.size_;
      _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition._32_8_;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.right;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ =
           (size_t)_kjCondition.op.content.ptr;
    }
    _kjCondition_1.left.ptr.isSet = (bool)(byte)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)&kj::none;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)anon_var_dwarf_43885;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.ptr = &DAT_00000005;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.size_._0_1_ = (byte)_kjCondition.left;
    if (((byte)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x9c,ERROR,
                 "\"failed: expected \" \"schema.findEnumerantByName(\\\"bar\\\") != kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected schema.findEnumerantByName(\"bar\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
    name_02.content.size_ = 4;
    name_02.content.ptr = "qux";
    EnumSchema::findEnumerantByName
              ((Maybe<capnp::EnumSchema::Enumerant> *)&_kjCondition,&schema,name_02);
    if ((byte)_kjCondition.left == '\x01') {
      _kjCondition_1.left.ptr.field_1._32_8_ = uStack_4d0;
      _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)local_4c8;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)_kjCondition.op.content.size_;
      _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition._32_8_;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.right;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ =
           (size_t)_kjCondition.op.content.ptr;
    }
    _kjCondition_1.left.ptr.isSet = (bool)(byte)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)&kj::none;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)anon_var_dwarf_43885;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.ptr = &DAT_00000005;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.size_._0_1_ = (byte)_kjCondition.left;
    if (((byte)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x9d,ERROR,
                 "\"failed: expected \" \"schema.findEnumerantByName(\\\"qux\\\") != kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected schema.findEnumerantByName(\"qux\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
    name_03.content.size_ = 6;
    name_03.content.ptr = "corge";
    EnumSchema::findEnumerantByName
              ((Maybe<capnp::EnumSchema::Enumerant> *)&_kjCondition,&schema,name_03);
    if ((byte)_kjCondition.left == '\x01') {
      _kjCondition_1.left.ptr.field_1._32_8_ = uStack_4d0;
      _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)local_4c8;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)_kjCondition.op.content.size_;
      _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition._32_8_;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.right;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ =
           (size_t)_kjCondition.op.content.ptr;
    }
    _kjCondition_1.left.ptr.isSet = (bool)(byte)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)&kj::none;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)anon_var_dwarf_43885;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.ptr = &DAT_00000005;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.size_._0_1_ = (byte)_kjCondition.left;
    if (((byte)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x9e,ERROR,
                 "\"failed: expected \" \"schema.findEnumerantByName(\\\"corge\\\") != kj::none\", _kjCondition"
                 ,(char (*) [65])
                  "failed: expected schema.findEnumerantByName(\"corge\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
    name_04.content.size_ = 7;
    name_04.content.ptr = "grault";
    EnumSchema::findEnumerantByName
              ((Maybe<capnp::EnumSchema::Enumerant> *)&_kjCondition,&schema,name_04);
    if ((bool)(byte)_kjCondition.left == true) {
      _kjCondition_1.left.ptr.field_1._32_8_ = uStack_4d0;
      _kjCondition_1.left.ptr.field_1.value.description.content.ptr = (char *)local_4c8;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)_kjCondition.op.content.size_;
      _kjCondition_1.left.ptr.field_1.value.file = (char *)_kjCondition._32_8_;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.ptr = (char *)_kjCondition.right;
      _kjCondition_1.left.ptr.field_1.value.ownFile.content.size_ =
           (size_t)_kjCondition.op.content.ptr;
    }
    _kjCondition_1.left.ptr.isSet = (bool)(byte)_kjCondition.left;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.disposer = (Disposer *)&kj::none;
    _kjCondition_1.left.ptr.field_1.value.context.ptr.ptr = (Context *)anon_var_dwarf_43885;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.ptr = &DAT_00000005;
    _kjCondition_1.left.ptr.field_1.value.remoteTrace.content.size_._0_1_ = (byte)_kjCondition.left;
    if (((bool)(byte)_kjCondition.left == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[66],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x9f,ERROR,
                 "\"failed: expected \" \"schema.findEnumerantByName(\\\"grault\\\") != kj::none\", _kjCondition"
                 ,(char (*) [66])
                  "failed: expected schema.findEnumerantByName(\"grault\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                 &_kjCondition_1);
    }
    return;
  }
  EnumSchema::getEnumerants((EnumerantList *)&_kjCondition_1,(EnumSchema *)&schema.super_Schema);
  local_6ec = _kjCondition_1.left.ptr.field_1._24_4_;
  Schema::getProto((Reader *)&lookup,&schema.super_Schema);
  auVar2 = (undefined1  [16])lookup._0_16_;
  enumerant.proto._reader.data = lookup.proto._reader.data;
  enumerant.proto._reader.pointers = lookup.proto._reader.pointers;
  enumerant.proto._reader.segment = lookup.proto._reader.segment;
  enumerant.proto._reader.capTable = lookup.proto._reader.capTable;
  enumerant.parent = lookup.parent;
  enumerant.ordinal = lookup.ordinal;
  enumerant._10_6_ = lookup._10_6_;
  lookup._0_16_ = auVar2;
  capnp::schema::Node::Enum::Reader::getEnumerants((Reader *)&_kjCondition,(Reader *)&enumerant);
  local_6f0 = (uint)_kjCondition.op.content.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
             ,0x91,FAILED,
             "(schema.getEnumerants().size()) == (schema.getProto().getEnum().getEnumerants().size())"
             ,
             "_kjCondition,schema.getEnumerants().size(), schema.getProto().getEnum().getEnumerants().size()"
             ,&_kjCondition_6,&local_6ec,&local_6f0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Schema, Enums) {
  EnumSchema schema = Schema::from<TestEnum>();

  EXPECT_EQ(typeId<TestEnum>(), schema.getProto().getId());

  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestEnum>()));

  EXPECT_NONFATAL_FAILURE(schema.asStruct());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());
  EXPECT_TRUE(schema.asEnum() == schema);

  ASSERT_EQ(schema.getEnumerants().size(),
            schema.getProto().getEnum().getEnumerants().size());
  EnumSchema::Enumerant enumerant = schema.getEnumerants()[0];
  EXPECT_EQ("foo", enumerant.getProto().getName());
  EXPECT_TRUE(enumerant.getContainingEnum() == schema);

  EnumSchema::Enumerant lookup = schema.getEnumerantByName("foo");
  EXPECT_TRUE(lookup == enumerant);
  EXPECT_TRUE(lookup != schema.getEnumerants()[1]);

  EXPECT_TRUE(schema.findEnumerantByName("noSuchEnumerant") == kj::none);

  EXPECT_TRUE(schema.findEnumerantByName("bar") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("qux") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("corge") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("grault") != kj::none);
}